

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

RandomBernoulliStaticLayerParams * __thiscall
CoreML::Specification::RandomBernoulliStaticLayerParams::New
          (RandomBernoulliStaticLayerParams *this,Arena *arena)

{
  RandomBernoulliStaticLayerParams *this_00;
  
  this_00 = (RandomBernoulliStaticLayerParams *)operator_new(0x38);
  RandomBernoulliStaticLayerParams(this_00);
  if (arena != (Arena *)0x0) {
    google::protobuf::Arena::Own<CoreML::Specification::RandomBernoulliStaticLayerParams>
              (arena,this_00);
  }
  return this_00;
}

Assistant:

RandomBernoulliStaticLayerParams* RandomBernoulliStaticLayerParams::New(::google::protobuf::Arena* arena) const {
  RandomBernoulliStaticLayerParams* n = new RandomBernoulliStaticLayerParams;
  if (arena != NULL) {
    arena->Own(n);
  }
  return n;
}